

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.H
# Opt level: O2

void __thiscall String::setValue(String *this,string *s)

{
  char *pcVar1;
  
  if (s->_M_string_length != 0) {
    pcVar1 = (char *)std::__cxx11::string::at((ulong)s);
    if (*pcVar1 == '@') {
      std::__cxx11::string::_M_assign((string *)this);
      this->_list = true;
      return;
    }
    if ((s->_M_string_length != 0) &&
       (pcVar1 = (char *)std::__cxx11::string::at((ulong)s), *pcVar1 == '!')) {
      std::__cxx11::string::assign((string *)this,(ulong)s,1);
      this->_no = true;
      return;
    }
  }
  std::__cxx11::string::_M_assign((string *)this);
  return;
}

Assistant:

inline void setValue(std::string const & s)
    {
        if (!s.empty() && '@' == s.at(0)) {
            std::string::assign(s);
            _list = true;
        }
        else if (!s.empty() && '!' == s.at(0))
        {
            std::string::assign(s, 1, std::string::npos);
            _no = true;
        }
        else
        {
            std::string::assign(s);
        }
    }